

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c.c
# Opt level: O0

char * atf_tc_get_config_var(atf_tc_t *tc,char *key)

{
  int iVar1;
  size_t __n;
  ulong local_30;
  size_t i;
  size_t key_length;
  char *key_local;
  atf_tc_t *tc_local;
  
  __n = strlen(key);
  local_30 = 0;
  while( true ) {
    if (tc->impl_->config_variables_size <= local_30) {
      return (char *)0x0;
    }
    iVar1 = strncmp(tc->impl_->config_variables_key[local_30],key,__n);
    if (iVar1 == 0) break;
    local_30 = local_30 + 1;
  }
  return tc->impl_->config_variables_value[local_30];
}

Assistant:

const char *
atf_tc_get_config_var(atf_tc_t const *tc, const char *key)
{
	size_t key_length = strlen(key);

	for (size_t i = 0; i < tc->impl_->config_variables_size; ++i) {
		if (strncmp(tc->impl_->config_variables_key[i], /**/
			key, key_length) == 0) {
			return tc->impl_->config_variables_value[i];
		}
	}

	return NULL;
}